

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O2

void qFloatToFloat16_fast(quint16 *out,float *in,qsizetype len)

{
  sbyte sVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (len < 8) {
    if ((~(uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i & 0x69f6ff) == 0) {
      sVar1 = ((byte)len < 0x21) * (' ' - (byte)len);
      uVar2 = (uint)(-1 << sVar1) >> sVar1;
      auVar4._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * (int)in[1];
      auVar4._0_4_ = (uint)((byte)uVar2 & 1) * (int)*in;
      auVar4._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * (int)in[2];
      auVar4._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * (int)in[3];
      auVar4._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * (int)in[4];
      auVar4._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * (int)in[5];
      auVar4._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * (int)in[6];
      auVar4._28_4_ = (uint)((byte)(uVar2 >> 7) & 1) * (int)in[7];
      auVar5 = vcvtps2ph_avx512vl(auVar4,0);
      auVar6._2_2_ = (ushort)((byte)(uVar2 >> 1) & 1) * auVar5._2_2_;
      auVar6._0_2_ = (ushort)((byte)uVar2 & 1) * auVar5._0_2_;
      auVar6._4_2_ = (ushort)((byte)(uVar2 >> 2) & 1) * auVar5._4_2_;
      auVar6._6_2_ = (ushort)((byte)(uVar2 >> 3) & 1) * auVar5._6_2_;
      auVar6._8_8_ = 0;
      auVar5 = vmovdqu16_avx512vl(auVar6);
      *(undefined1 (*) [16])out = auVar5;
      return;
    }
    if (3 < len) {
      vcvtps2ph_f16c(*(undefined1 (*) [16])in,0);
      vcvtps2ph_f16c(*(undefined1 (*) [16])(in + len + -4),0);
      return;
    }
    lVar3 = 0;
    if (len < 1) {
      len = lVar3;
    }
    for (; len != lVar3; lVar3 = lVar3 + 1) {
      auVar5 = vcvtps2ph_f16c(ZEXT416((uint)in[lVar3]),0);
      vpextrw_avx(auVar5,0);
    }
  }
  else {
    for (lVar3 = 8; lVar3 < len; lVar3 = lVar3 + 8) {
      auVar5 = vcvtps2ph_f16c(*(undefined1 (*) [32])(in + lVar3 + -8),0);
      *(undefined1 (*) [16])(out + lVar3 + -8) = auVar5;
    }
    auVar5 = vcvtps2ph_f16c(*(undefined1 (*) [32])(in + len + -8),0);
    *(undefined1 (*) [16])(out + len + -8) = auVar5;
  }
  return;
}

Assistant:

static void qFloatToFloat16_fast(quint16 *out, const float *in, qsizetype len) noexcept
{
    constexpr qsizetype Step = sizeof(__m256i) / sizeof(float);
    constexpr qsizetype HalfStep = sizeof(__m128i) / sizeof(float);
    qsizetype i = 0;

    if (len >= Step) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m256 f32 = _mm256_loadu_ps(in + offset);
            __m128i f16 = _mm256_cvtps_ph(f32, _MM_FROUND_TO_NEAREST_INT);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(out + offset), f16);
        };

        // main loop: convert Step (8) floats per iteration
        for ( ; i + Step < len; i += Step)
            convertOneChunk(i);

        // epilogue: convert the last chunk, possibly overlapping with the last
        // iteration of the loop
        return convertOneChunk(len - Step);
    }

#if QT_COMPILER_SUPPORTS_HERE(AVX512VL) && QT_COMPILER_SUPPORTS_HERE(AVX512BW)
    if (hasFastF16Avx256())
        return qFloatToFloat16_tail_avx256(out, in, len);
#endif

    if (len >= HalfStep) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128 f32 = _mm_loadu_ps(in + offset);
            __m128i f16 = _mm_cvtps_ph(f32, _MM_FROUND_TO_NEAREST_INT);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(out + offset), f16);
        };

        // two conversions, possibly overlapping
        convertOneChunk(0);
        return convertOneChunk(len - HalfStep);
    }

    // Inlining "qfloat16::qfloat16(float f)":
    for ( ; i < len; ++i)
        out[i] = _mm_extract_epi16(_mm_cvtps_ph(_mm_set_ss(in[i]), 0), 0);
}